

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

VkImageLayout
vkt::memory::anon_unknown_0::getRandomNextLayout
          (Random *rng,Usage usage,VkImageLayout previousLayout)

{
  VkImageLayout layout;
  bool bVar1;
  size_t sVar2;
  deUint64 dVar3;
  ulong uVar4;
  long lVar5;
  
  sVar2 = getNumberOfSupportedLayouts(usage);
  dVar3 = de::Random::getUint64(rng);
  lVar5 = 0;
  uVar4 = dVar3 % ((sVar2 - 1) + (ulong)(previousLayout == VK_IMAGE_LAYOUT_UNDEFINED));
  do {
    if (lVar5 == 0x1c) {
      return VK_IMAGE_LAYOUT_UNDEFINED;
    }
    layout = *(VkImageLayout *)((long)&DAT_009c46d0 + lVar5);
    bVar1 = layoutSupportedByUsage(usage,layout);
    if ((layout != previousLayout) && (bVar1)) {
      if (uVar4 == 0) {
        return layout;
      }
      uVar4 = uVar4 - 1;
    }
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

vk::VkImageLayout getRandomNextLayout (de::Random&			rng,
									   Usage				usage,
									   vk::VkImageLayout	previousLayout)
{
	const vk::VkImageLayout	layouts[] =
	{
		vk::VK_IMAGE_LAYOUT_GENERAL,
		vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
		vk::VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
	};
	const size_t			supportedLayoutCount = getNumberOfSupportedLayouts(usage);

	DE_ASSERT(supportedLayoutCount > 0);

	size_t nextLayoutNdx = ((size_t)rng.getUint64()) % (previousLayout == vk::VK_IMAGE_LAYOUT_UNDEFINED
														? supportedLayoutCount
														: supportedLayoutCount - 1);

	for (size_t layoutNdx = 0; layoutNdx < DE_LENGTH_OF_ARRAY(layouts); layoutNdx++)
	{
		const vk::VkImageLayout layout = layouts[layoutNdx];

		if (layoutSupportedByUsage(usage, layout) && layout != previousLayout)
		{
			if (nextLayoutNdx == 0)
				return layout;
			else
				nextLayoutNdx--;
		}
	}

	DE_FATAL("Unreachable");
	return vk::VK_IMAGE_LAYOUT_UNDEFINED;
}